

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

enable_if_t<_detail::move_never<stepping_variable>::value,_AbstractIsolineTracer<>::stepping_variable>
 pybind11::move<AbstractIsolineTracer<double>::stepping_variable>(object *obj)

{
  itype *piVar1;
  cast_error *this;
  handle local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)((obj->super_handle).m_ptr)->ob_refcnt < 2) {
    detail::load_type<AbstractIsolineTracer<double>::stepping_variable>
              ((make_caster<AbstractIsolineTracer<>::stepping_variable> *)&local_d8,
               &obj->super_handle);
    piVar1 = detail::type_caster_base::operator_cast_to_stepping_variable_
                       ((type_caster_base *)&local_d8);
    return *piVar1;
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  local_e0.m_ptr = (PyObject *)PyObject_Str(((obj->super_handle).m_ptr)->ob_type);
  str::operator_cast_to_string(&local_98,(str *)&local_e0);
  std::operator+(&local_78,"Unable to move from Python ",&local_98);
  std::operator+(&local_58,&local_78," instance to C++ ");
  type_id<AbstractIsolineTracer<double>::stepping_variable>();
  std::operator+(&local_38,&local_58,&local_b8);
  std::operator+(&local_d8,&local_38," instance: instance has multiple references");
  cast_error::runtime_error(this,&local_d8);
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}